

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int BUFFER_fill(BUFFER_HANDLE handle,uchar fill_char)

{
  size_t index;
  ulong uVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  if (handle == (BUFFER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x25a;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/buffer.c"
                ,"BUFFER_fill",0x259,1,"Invalid parameter specified, handle == NULL.");
    }
  }
  else {
    iVar3 = 0;
    for (uVar1 = 0; uVar1 < handle->size; uVar1 = uVar1 + 1) {
      handle->buffer[uVar1] = fill_char;
    }
  }
  return iVar3;
}

Assistant:

int BUFFER_fill(BUFFER_HANDLE handle, unsigned char fill_char)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_BUFFER_07_002: [ If handle is NULL BUFFER_fill shall return a non-zero value. ] */
        LogError("Invalid parameter specified, handle == NULL.");
        result = MU_FAILURE;
    }
    else
    {
        size_t index;
        /* Codes_SRS_BUFFER_07_001: [ BUFFER_fill shall fill the supplied BUFFER_HANDLE with the supplied fill character. ] */
        BUFFER* buffer_data = (BUFFER*)handle;
        for (index = 0; index < buffer_data->size; index++)
        {
            buffer_data->buffer[index] = fill_char;
        }
        result = 0;
    }
    return result;
}